

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O3

BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39> __thiscall
mp::BasicExprFactory<std::allocator<char>>::
MakeIf<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
          (BasicExprFactory<std::allocator<char>> *this,LogicalExpr condition,
          BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> then_expr,
          BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> else_expr)

{
  Impl *impl;
  BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39> BVar1;
  AssertionFailure *this_00;
  Impl *local_28;
  
  if ((condition.super_ExprBase.impl_ != (Impl *)0x0) &&
     (then_expr.super_ExprBase.impl_ != (Impl *)0x0)) {
    local_28 = (Impl *)0x0;
    std::
    vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
    ::emplace_back<mp::internal::ExprBase::Impl_const*>
              ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
                *)(this + 8),&local_28);
    impl = (Impl *)operator_new__(0x100);
    impl->kind_ = IF;
    *(Impl **)(*(long *)(this + 0x10) + -8) = impl;
    *(ExprBase *)&impl[2].kind_ = condition.super_ExprBase.impl_;
    *(ExprBase *)&impl[4].kind_ = then_expr.super_ExprBase.impl_;
    *(ExprBase *)&impl[6].kind_ = else_expr.super_ExprBase.impl_;
    BVar1 = internal::ExprBase::
            Create<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>>
                      (impl);
    return (BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39>)
           BVar1.super_BasicExpr<(mp::expr::Kind)39,_(mp::expr::Kind)39>.super_ExprBase.impl_;
  }
  this_00 = (AssertionFailure *)__cxa_allocate_exception(0x10);
  AssertionFailure::AssertionFailure(this_00,"invalid argument");
  __cxa_throw(this_00,&AssertionFailure::typeinfo,std::logic_error::~logic_error);
}

Assistant:

operator SafeBool() const { return impl_ != 0 ? &ExprBase::True : 0; }